

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRotationGate1.hpp
# Opt level: O1

void __thiscall
qclab::qgates::QRotationGate1<std::complex<float>_>::QRotationGate1
          (QRotationGate1<std::complex<float>_> *this,int qubit,real_type theta,bool fixed)

{
  float fVar1;
  
  (this->super_QGate1<std::complex<float>_>).super_QObject<std::complex<float>_>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_00139b48;
  (this->super_QGate1<std::complex<float>_>).qubit_ = qubit;
  if (-1 < qubit) {
    (this->super_QGate1<std::complex<float>_>).field_0xc = fixed;
    (this->super_QGate1<std::complex<float>_>).super_QObject<std::complex<float>_>._vptr_QObject =
         (_func_int **)&PTR_nbQubits_00139e88;
    fVar1 = cosf(theta * 0.5);
    (this->rotation_).angle_.cos_ = fVar1;
    fVar1 = sinf(theta * 0.5);
    (this->rotation_).angle_.sin_ = fVar1;
    return;
  }
  __assert_fail("qubit >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/QGate1.hpp"
                ,0x21,
                "qclab::qgates::QGate1<std::complex<float>>::QGate1(const int) [T = std::complex<float>]"
               );
}

Assistant:

QRotationGate1()
        : QGate1< T >( 0 )
        , rotation_()
        , QAdjustable()
        { }